

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::emptyConstructorTest<true>(ViewTest *this)

{
  logic_error *this_00;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  View<int,_true,_std::allocator<unsigned_long>_> local_50;
  
  local_50.data_ = (pointer)0x0;
  local_50.geometry_.shape_ = (size_t *)0x0;
  local_50.geometry_.shapeStrides_ = (size_t *)0x0;
  local_50.geometry_.strides_ = (size_t *)0x0;
  local_50.geometry_.dimension_ = 0;
  local_50.geometry_.size_ = 0;
  local_50.geometry_.coordinateOrder_ = LastMajorOrder;
  local_50.geometry_.isSimple_ = true;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_50);
  if (local_50.geometry_.size_ == 0) {
    operator_delete(local_50.geometry_.shape_,local_50.geometry_.dimension_ * 0x18);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"test failed.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ViewTest::emptyConstructorTest() {
    andres::View<int, constTarget> v;   
    
    test(v.size() == 0
        );
}